

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.h
# Opt level: O0

bool __thiscall
GenericFunctionInstanceTypeRequest::operator==
          (GenericFunctionInstanceTypeRequest *this,GenericFunctionInstanceTypeRequest *rhs)

{
  MatchData *local_40;
  MatchData *rightAlias;
  MatchData *leftAlias;
  TypeHandle *rightArg;
  TypeHandle *leftArg;
  GenericFunctionInstanceTypeRequest *rhs_local;
  GenericFunctionInstanceTypeRequest *this_local;
  
  if (this->parentType == rhs->parentType) {
    if (this->function == rhs->function) {
      leftAlias = (MatchData *)(rhs->arguments).head;
      for (rightArg = (this->arguments).head;
          rightArg != (TypeHandle *)0x0 || leftAlias != (MatchData *)0x0; rightArg = rightArg->next)
      {
        if ((rightArg == (TypeHandle *)0x0) || (leftAlias == (MatchData *)0x0)) {
          return false;
        }
        if (rightArg->type != (TypeBase *)leftAlias->name) {
          return false;
        }
        leftAlias = (MatchData *)leftAlias->type;
      }
      local_40 = (rhs->aliases).head;
      for (rightAlias = (this->aliases).head;
          rightAlias != (MatchData *)0x0 || local_40 != (MatchData *)0x0;
          rightAlias = rightAlias->next) {
        if ((rightAlias == (MatchData *)0x0) || (local_40 == (MatchData *)0x0)) {
          return false;
        }
        if ((rightAlias->name != local_40->name) || (rightAlias->type != local_40->type)) {
          return false;
        }
        local_40 = local_40->next;
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool operator==(const GenericFunctionInstanceTypeRequest& rhs) const
	{
		if(parentType != rhs.parentType)
			return false;

		if(function != rhs.function)
			return false;

		for(TypeHandle *leftArg = arguments.head, *rightArg = rhs.arguments.head; leftArg || rightArg; leftArg = leftArg->next, rightArg = rightArg->next)
		{
			if(!leftArg || !rightArg)
				return false;

			if(leftArg->type != rightArg->type)
				return false;
		}

		for(MatchData *leftAlias = aliases.head, *rightAlias = rhs.aliases.head; leftAlias || rightAlias; leftAlias = leftAlias->next, rightAlias = rightAlias->next)
		{
			if(!leftAlias || !rightAlias)
				return false;

			if(leftAlias->name != rightAlias->name || leftAlias->type != rightAlias->type)
				return false;
		}

		return true;
	}